

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

int write_dot_dot_entry(archive_write *a,mtree_entry_conflict *n)

{
  mtree_writer *mtree_00;
  int iVar1;
  int local_28;
  int pd;
  int i;
  int ret;
  mtree_writer *mtree;
  mtree_entry_conflict *n_local;
  archive_write *a_local;
  
  mtree_00 = (mtree_writer *)a->format_data;
  if ((n->parentdir).s != (char *)0x0) {
    if (mtree_00->indent != 0) {
      iVar1 = mtree_00->depth;
      for (local_28 = 0; local_28 < iVar1 << 2; local_28 = local_28 + 1) {
        archive_strappend_char(&mtree_00->buf,' ');
      }
    }
    archive_string_sprintf(&mtree_00->buf,"# %s/%s\n",(n->parentdir).s,(n->basename).s);
  }
  if (mtree_00->indent == 0) {
    iVar1 = 4;
    if (mtree_00->dironly != 0) {
      iVar1 = 3;
    }
    archive_strncat(&mtree_00->buf,"..\n\n",(long)iVar1);
  }
  else {
    (mtree_00->ebuf).length = 0;
    iVar1 = 4;
    if (mtree_00->dironly != 0) {
      iVar1 = 3;
    }
    archive_strncat(&mtree_00->ebuf,"..\n\n",(long)iVar1);
    mtree_indent(mtree_00);
  }
  if ((mtree_00->buf).length < 0x8001) {
    pd = 0;
  }
  else {
    pd = __archive_write_output(a,(mtree_00->buf).s,(mtree_00->buf).length);
    (mtree_00->buf).length = 0;
  }
  return pd;
}

Assistant:

static int
write_dot_dot_entry(struct archive_write *a, struct mtree_entry *n)
{
	struct mtree_writer *mtree = a->format_data;
	int ret;

	if (n->parentdir.s) {
		if (mtree->indent) {
			int i, pd = mtree->depth * 4;
			for (i = 0; i < pd; i++)
				archive_strappend_char(&mtree->buf, ' ');
		}
		archive_string_sprintf(&mtree->buf, "# %s/%s\n",
			n->parentdir.s, n->basename.s);
	}

	if (mtree->indent) {
		archive_string_empty(&mtree->ebuf);
		archive_strncat(&mtree->ebuf, "..\n\n", (mtree->dironly)?3:4);
		mtree_indent(mtree);
	} else
		archive_strncat(&mtree->buf, "..\n\n", (mtree->dironly)?3:4);

	if (mtree->buf.length > 32768) {
		ret = __archive_write_output(
			a, mtree->buf.s, mtree->buf.length);
		archive_string_empty(&mtree->buf);
	} else
		ret = ARCHIVE_OK;
	return (ret);
}